

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QList<int> * __thiscall QColumnView::columnWidths(QColumnView *this)

{
  QColumnViewPrivate *pQVar1;
  qsizetype qVar2;
  QList<int> *in_RDI;
  int i;
  int columnCount;
  QColumnViewPrivate *d;
  QList<int> *list;
  qsizetype in_stack_00000038;
  QList<int> *this_00;
  int local_24;
  QList<int> *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  pQVar1 = d_func((QColumnView *)0x8654d8);
  (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x86550c);
  qVar2 = QList<QAbstractItemView_*>::size(&pQVar1->columns);
  QList<int>::reserve(this_01,in_stack_00000038);
  for (local_24 = 0; local_24 < (int)qVar2; local_24 = local_24 + 1) {
    QList<int>::at(this_00,(qsizetype)in_RDI);
    QList<int>::append((QList<int> *)0x865564,(parameter_type)((ulong)in_RDI >> 0x20));
  }
  return in_RDI;
}

Assistant:

QList<int> QColumnView::columnWidths() const
{
    Q_D(const QColumnView);
    QList<int> list;
    const int columnCount = d->columns.size();
    list.reserve(columnCount);
    for (int i = 0; i < columnCount; ++i)
        list.append(d->columnSizes.at(i));
    return list;
}